

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_paeth_predictor_8x8_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  __m128i row;
  __m128i l16;
  int i;
  __m128i one;
  __m128i rep;
  __m128i tl16;
  __m128i t16;
  __m128i zero;
  __m128i t;
  __m128i l;
  __m128i local_218;
  int local_1fc;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  ulong local_1d8;
  ulong uStack_1d0;
  undefined1 local_1c8;
  undefined1 uStack_1c7;
  undefined1 uStack_1c6;
  undefined1 uStack_1c5;
  undefined1 uStack_1c4;
  undefined1 uStack_1c3;
  undefined1 uStack_1c2;
  undefined1 uStack_1c1;
  undefined1 uStack_1c0;
  undefined1 uStack_1bf;
  undefined1 uStack_1be;
  undefined1 uStack_1bd;
  undefined1 uStack_1bc;
  undefined1 uStack_1bb;
  undefined1 uStack_1ba;
  undefined1 uStack_1b9;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  long local_178;
  undefined8 *local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined2 local_ee;
  undefined2 local_ec;
  ushort local_ea;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  short local_b8;
  short sStack_b6;
  short sStack_b4;
  short sStack_b2;
  short sStack_b0;
  short sStack_ae;
  short sStack_ac;
  short sStack_aa;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  char local_88;
  char cStack_87;
  char cStack_86;
  char cStack_85;
  char cStack_84;
  char cStack_83;
  char cStack_82;
  char cStack_81;
  char cStack_80;
  char cStack_7f;
  char cStack_7e;
  char cStack_7d;
  char cStack_7c;
  char cStack_7b;
  char cStack_7a;
  char cStack_79;
  undefined8 *local_70;
  ulong local_68;
  ulong uStack_60;
  ushort local_58;
  ushort local_56;
  ushort local_54;
  ushort local_52;
  ushort local_50;
  ushort local_4e;
  ushort local_4c;
  ushort local_4a;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined2 local_38;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  undefined2 local_30;
  undefined2 local_2e;
  undefined2 local_2c;
  undefined2 local_2a;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  
  local_198 = *in_RCX;
  uStack_140 = 0;
  uStack_190 = 0;
  local_1a8 = *in_RDX;
  uStack_160 = 0;
  uStack_1a0 = 0;
  local_128 = 0;
  uStack_120 = 0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  uStack_100 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_108._0_1_ = (undefined1)local_1a8;
  local_108._1_1_ = (undefined1)((ulong)local_1a8 >> 8);
  local_108._2_1_ = (undefined1)((ulong)local_1a8 >> 0x10);
  local_108._3_1_ = (undefined1)((ulong)local_1a8 >> 0x18);
  local_108._4_1_ = (undefined1)((ulong)local_1a8 >> 0x20);
  local_108._5_1_ = (undefined1)((ulong)local_1a8 >> 0x28);
  local_108._6_1_ = (undefined1)((ulong)local_1a8 >> 0x30);
  local_108._7_1_ = (undefined1)((ulong)local_1a8 >> 0x38);
  local_1c8 = (undefined1)local_108;
  uStack_1c7 = 0;
  uStack_1c6 = local_108._1_1_;
  uStack_1c5 = 0;
  uStack_1c4 = local_108._2_1_;
  uStack_1c3 = 0;
  uStack_1c2 = local_108._3_1_;
  uStack_1c1 = 0;
  uStack_1c0 = local_108._4_1_;
  uStack_1bf = 0;
  uStack_1be = local_108._5_1_;
  uStack_1bd = 0;
  uStack_1bc = local_108._6_1_;
  uStack_1bb = 0;
  uStack_1ba = local_108._7_1_;
  uStack_1b9 = 0;
  bVar1 = *(byte *)((long)in_RDX + -1);
  local_ea = (ushort)bVar1;
  local_1d8 = (ulong)CONCAT16(bVar1,(uint6)CONCAT14(bVar1,(uint)CONCAT12(bVar1,local_ea)));
  uStack_1d0 = (ulong)CONCAT16(bVar1,(uint6)CONCAT14(bVar1,(uint)CONCAT12(bVar1,local_ea)));
  local_ec = 0x8000;
  local_2a = 0x8000;
  local_2c = 0x8000;
  local_2e = 0x8000;
  local_30 = 0x8000;
  local_32 = 0x8000;
  local_34 = 0x8000;
  local_36 = 0x8000;
  local_38 = 0x8000;
  local_1e8 = 0x8000800080008000;
  uStack_1e0 = 0x8000800080008000;
  local_ee = 1;
  local_2 = 1;
  local_4 = 1;
  local_6 = 1;
  local_8 = 1;
  local_a = 1;
  local_c = 1;
  local_e = 1;
  local_10 = 1;
  local_1f8 = 0x1000100010001;
  uStack_1f0 = 0x1000100010001;
  local_178 = in_RSI;
  local_170 = in_RDI;
  local_168 = local_1a8;
  local_148 = local_198;
  local_108 = local_1a8;
  local_68 = local_1d8;
  uStack_60 = uStack_1d0;
  local_58 = local_ea;
  local_56 = local_ea;
  local_54 = local_ea;
  local_52 = local_ea;
  local_50 = local_ea;
  local_4e = local_ea;
  local_4c = local_ea;
  local_4a = local_ea;
  local_48 = local_1e8;
  uStack_40 = uStack_1e0;
  local_28 = local_1f8;
  uStack_20 = uStack_1f0;
  for (local_1fc = 0; local_1fc < 8; local_1fc = local_1fc + 1) {
    local_d8 = local_198;
    uStack_d0 = uStack_190;
    local_e8 = local_1e8;
    uStack_e0 = uStack_1e0;
    auVar11._8_8_ = uStack_190;
    auVar11._0_8_ = local_198;
    auVar10._8_8_ = uStack_1e0;
    auVar10._0_8_ = local_1e8;
    local_218 = (__m128i)pshufb(auVar11,auVar10);
    paeth_8x1_pred(&local_218,(__m128i *)&local_1c8,(__m128i *)&local_1d8);
    local_70 = local_170;
    local_b8 = (short)extraout_XMM0_Qa;
    sStack_b6 = (short)((ulong)extraout_XMM0_Qa >> 0x10);
    sStack_b4 = (short)((ulong)extraout_XMM0_Qa >> 0x20);
    sStack_b2 = (short)((ulong)extraout_XMM0_Qa >> 0x30);
    sStack_b0 = (short)extraout_XMM0_Qb;
    sStack_ae = (short)((ulong)extraout_XMM0_Qb >> 0x10);
    sStack_ac = (short)((ulong)extraout_XMM0_Qb >> 0x20);
    sStack_aa = (short)((ulong)extraout_XMM0_Qb >> 0x30);
    local_88 = (0 < local_b8) * (local_b8 < 0x100) * (char)extraout_XMM0_Qa - (0xff < local_b8);
    cVar2 = (char)((ulong)extraout_XMM0_Qa >> 0x10);
    cStack_87 = (0 < sStack_b6) * (sStack_b6 < 0x100) * cVar2 - (0xff < sStack_b6);
    cVar3 = (char)((ulong)extraout_XMM0_Qa >> 0x20);
    cStack_86 = (0 < sStack_b4) * (sStack_b4 < 0x100) * cVar3 - (0xff < sStack_b4);
    cVar4 = (char)((ulong)extraout_XMM0_Qa >> 0x30);
    cStack_85 = (0 < sStack_b2) * (sStack_b2 < 0x100) * cVar4 - (0xff < sStack_b2);
    cStack_84 = (0 < sStack_b0) * (sStack_b0 < 0x100) * (char)extraout_XMM0_Qb - (0xff < sStack_b0);
    cVar5 = (char)((ulong)extraout_XMM0_Qb >> 0x10);
    cStack_83 = (0 < sStack_ae) * (sStack_ae < 0x100) * cVar5 - (0xff < sStack_ae);
    cVar6 = (char)((ulong)extraout_XMM0_Qb >> 0x20);
    cStack_82 = (0 < sStack_ac) * (sStack_ac < 0x100) * cVar6 - (0xff < sStack_ac);
    cVar7 = (char)((ulong)extraout_XMM0_Qb >> 0x30);
    cStack_81 = (0 < sStack_aa) * (sStack_aa < 0x100) * cVar7 - (0xff < sStack_aa);
    cStack_80 = (0 < local_b8) * (local_b8 < 0x100) * (char)extraout_XMM0_Qa - (0xff < local_b8);
    cStack_7f = (0 < sStack_b6) * (sStack_b6 < 0x100) * cVar2 - (0xff < sStack_b6);
    cStack_7e = (0 < sStack_b4) * (sStack_b4 < 0x100) * cVar3 - (0xff < sStack_b4);
    cStack_7d = (0 < sStack_b2) * (sStack_b2 < 0x100) * cVar4 - (0xff < sStack_b2);
    cStack_7c = (0 < sStack_b0) * (sStack_b0 < 0x100) * (char)extraout_XMM0_Qb - (0xff < sStack_b0);
    cStack_7b = (0 < sStack_ae) * (sStack_ae < 0x100) * cVar5 - (0xff < sStack_ae);
    cStack_7a = (0 < sStack_ac) * (sStack_ac < 0x100) * cVar6 - (0xff < sStack_ac);
    cStack_79 = (0 < sStack_aa) * (sStack_aa < 0x100) * cVar7 - (0xff < sStack_aa);
    *local_170 = CONCAT17(cStack_81,
                          CONCAT16(cStack_82,
                                   CONCAT15(cStack_83,
                                            CONCAT14(cStack_84,
                                                     CONCAT13(cStack_85,
                                                              CONCAT12(cStack_86,
                                                                       CONCAT11(cStack_87,local_88))
                                                             )))));
    local_170 = (undefined8 *)(local_178 + (long)local_170);
    uVar8 = local_1e8;
    uVar9 = uStack_1e0;
    local_98._0_2_ = (short)local_1e8;
    local_98._2_2_ = (short)((ulong)local_1e8 >> 0x10);
    local_98._4_2_ = (short)((ulong)local_1e8 >> 0x20);
    local_98._6_2_ = (short)((ulong)local_1e8 >> 0x30);
    uStack_90._0_2_ = (short)uStack_1e0;
    uStack_90._2_2_ = (short)((ulong)uStack_1e0 >> 0x10);
    uStack_90._4_2_ = (short)((ulong)uStack_1e0 >> 0x20);
    uStack_90._6_2_ = (short)((ulong)uStack_1e0 >> 0x30);
    local_a8._0_2_ = (short)local_1f8;
    local_a8._2_2_ = (short)((ulong)local_1f8 >> 0x10);
    local_a8._4_2_ = (short)((ulong)local_1f8 >> 0x20);
    local_a8._6_2_ = (short)((ulong)local_1f8 >> 0x30);
    uStack_a0._0_2_ = (short)uStack_1f0;
    uStack_a0._2_2_ = (short)((ulong)uStack_1f0 >> 0x10);
    uStack_a0._4_2_ = (short)((ulong)uStack_1f0 >> 0x20);
    uStack_a0._6_2_ = (short)((ulong)uStack_1f0 >> 0x30);
    local_1e8 = CONCAT26(local_98._6_2_ + local_a8._6_2_,
                         CONCAT24(local_98._4_2_ + local_a8._4_2_,
                                  CONCAT22(local_98._2_2_ + local_a8._2_2_,
                                           (short)local_98 + (short)local_a8)));
    uStack_1e0 = CONCAT26(uStack_90._6_2_ + uStack_a0._6_2_,
                          CONCAT24(uStack_90._4_2_ + uStack_a0._4_2_,
                                   CONCAT22(uStack_90._2_2_ + uStack_a0._2_2_,
                                            (short)uStack_90 + (short)uStack_a0)));
    local_a8 = local_1f8;
    uStack_a0 = uStack_1f0;
    local_98 = uVar8;
    uStack_90 = uVar9;
  }
  return;
}

Assistant:

void aom_paeth_predictor_8x8_ssse3(uint8_t *dst, ptrdiff_t stride,
                                   const uint8_t *above, const uint8_t *left) {
  __m128i l = _mm_loadl_epi64((const __m128i *)left);
  const __m128i t = _mm_loadl_epi64((const __m128i *)above);
  const __m128i zero = _mm_setzero_si128();
  const __m128i t16 = _mm_unpacklo_epi8(t, zero);
  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  __m128i rep = _mm_set1_epi16((short)0x8000);
  const __m128i one = _mm_set1_epi16(1);

  int i;
  for (i = 0; i < 8; ++i) {
    const __m128i l16 = _mm_shuffle_epi8(l, rep);
    const __m128i row = paeth_8x1_pred(&l16, &t16, &tl16);

    _mm_storel_epi64((__m128i *)dst, _mm_packus_epi16(row, row));
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }
}